

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O1

size_t ZSTD_decompressSequences
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  BYTE BVar4;
  BYTE *base;
  seq_t sequence;
  bool bVar5;
  uint uVar6;
  BYTE *op_2;
  size_t sVar7;
  long lVar8;
  BYTE *pBVar9;
  ulong uVar10;
  BYTE *pBVar11;
  BYTE *pBVar12;
  ulong uVar13;
  uint uVar14;
  BYTE *pBVar15;
  BYTE *oend_00;
  BYTE *oend;
  BYTE *pBVar16;
  ulong unaff_R13;
  int iVar17;
  BYTE *ip_1;
  BYTE *pBVar18;
  ulong uVar19;
  size_t sVar20;
  BYTE *litPtr;
  BIT_DStream_t local_138;
  ZSTD_fseState local_110;
  ZSTD_fseState local_100;
  ZSTD_fseState local_f0;
  ulong local_e0 [7];
  BYTE *local_a8;
  BYTE *local_a0;
  BYTE *local_98;
  int local_8c;
  BYTE *local_88;
  BYTE *local_80;
  BYTE *local_78;
  ZSTD_DCtx *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  size_t sStack_48;
  ulong local_40;
  BYTE *pBStack_38;
  
  if (dctx->bmi2 != 0) {
    sVar7 = ZSTD_decompressSequences_bmi2(dctx,dst,maxDstSize,seqStart,seqSize,nbSeq,isLongOffset);
    return sVar7;
  }
  oend_00 = (BYTE *)(maxDstSize + (long)dst);
  local_a0 = dctx->litPtr;
  pBVar9 = local_a0 + dctx->litSize;
  pBVar15 = (BYTE *)dst;
  if (nbSeq == 0) goto LAB_00150351;
  base = (BYTE *)dctx->prefixStart;
  local_80 = (BYTE *)dctx->virtualStart;
  local_88 = (BYTE *)dctx->dictEnd;
  dctx->fseEntropy = 1;
  lVar8 = -0xc;
  do {
    *(ulong *)((long)local_e0 + lVar8 * 2 + 0x18) = (ulong)*(uint *)((long)dctx->workspace + lVar8);
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0);
  if (seqSize == 0) {
    local_138.ptr = (char *)0x0;
    local_138.start = (char *)0x0;
    local_138.bitContainer = 0;
    local_138.bitsConsumed = 0;
    local_138._12_4_ = 0;
    local_138.limitPtr = (char *)0x0;
LAB_0014fc35:
    bVar5 = false;
    unaff_R13 = 0xffffffffffffffec;
  }
  else {
    local_138.limitPtr = (char *)((long)seqStart + 8);
    local_138.start = (char *)seqStart;
    if (seqSize < 8) {
      local_138.bitContainer = (size_t)*seqStart;
      switch(seqSize) {
      case 7:
        local_138.bitContainer =
             (ulong)*(byte *)((long)seqStart + 6) << 0x30 | local_138.bitContainer;
      case 6:
        local_138.bitContainer =
             local_138.bitContainer + ((ulong)*(byte *)((long)seqStart + 5) << 0x28);
      case 5:
        local_138.bitContainer =
             local_138.bitContainer + ((ulong)*(byte *)((long)seqStart + 4) << 0x20);
      case 4:
        local_138.bitContainer =
             local_138.bitContainer + (ulong)*(byte *)((long)seqStart + 3) * 0x1000000;
      case 3:
        local_138.bitContainer =
             local_138.bitContainer + (ulong)*(byte *)((long)seqStart + 2) * 0x10000;
      case 2:
        local_138.bitContainer =
             local_138.bitContainer + (ulong)*(byte *)((long)seqStart + 1) * 0x100;
      }
      bVar1 = *(byte *)((long)seqStart + (seqSize - 1));
      uVar6 = 0x1f;
      if (bVar1 != 0) {
        for (; bVar1 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      local_138.bitsConsumed = ~uVar6 + 9;
      if (bVar1 == 0) {
        local_138.bitsConsumed = 0;
      }
      local_138.ptr = (char *)seqStart;
      if (bVar1 == 0) goto LAB_0014fc35;
      local_138.bitsConsumed = local_138.bitsConsumed + (int)seqSize * -8 + 0x40;
    }
    else {
      local_138.ptr = (char *)((long)seqStart + (seqSize - 8));
      local_138.bitContainer = *(size_t *)local_138.ptr;
      bVar1 = *(byte *)((long)seqStart + (seqSize - 1));
      uVar6 = 0x1f;
      if (bVar1 != 0) {
        for (; bVar1 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      local_138.bitsConsumed = ~uVar6 + 9;
      if (bVar1 == 0) {
        local_138.bitsConsumed = 0;
      }
      if (bVar1 == 0 || 0xffffffffffffff88 < seqSize) goto LAB_0014fc35;
    }
    local_a8 = pBVar9;
    ZSTD_initFseState(&local_110,&local_138,dctx->LLTptr);
    ZSTD_initFseState(&local_100,&local_138,dctx->OFTptr);
    ZSTD_initFseState(&local_f0,&local_138,dctx->MLTptr);
    local_98 = oend_00 + -8;
    local_78 = oend_00 + -0xd;
    local_70 = dctx;
    do {
      uVar13 = local_e0[1];
      uVar6 = local_138.bitsConsumed;
      iVar17 = (int)local_138.start;
      if (local_138.bitsConsumed < 0x41) {
        if (local_138.ptr < local_138.limitPtr) {
          if (local_138.ptr == local_138.start) goto LAB_0014fdc8;
          uVar19 = (ulong)(uint)((int)local_138.ptr - iVar17);
          if (local_138.start <=
              (ulong *)((long)local_138.ptr - (ulong)(local_138.bitsConsumed >> 3))) {
            uVar19 = (ulong)(local_138.bitsConsumed >> 3);
          }
          uVar14 = local_138.bitsConsumed + (int)uVar19 * -8;
        }
        else {
          uVar19 = (ulong)(local_138.bitsConsumed >> 3);
          uVar14 = local_138.bitsConsumed & 7;
        }
        local_138.ptr = (char *)((long)local_138.ptr - uVar19);
        local_138.bitsConsumed = uVar14;
        local_138.bitContainer = *(size_t *)local_138.ptr;
      }
LAB_0014fdc8:
      if ((0x40 < uVar6) || (nbSeq == 0)) {
        if (nbSeq == 0) {
          pBVar9 = local_a8;
          if (local_138.bitsConsumed < 0x41) {
            if (local_138.ptr < local_138.limitPtr) {
              if (local_138.ptr != local_138.start) {
                uVar13 = (ulong)(uint)((int)local_138.ptr - iVar17);
                if (local_138.start <=
                    (ulong *)((long)local_138.ptr - (ulong)(local_138.bitsConsumed >> 3))) {
                  uVar13 = (ulong)(local_138.bitsConsumed >> 3);
                }
                local_138.bitsConsumed = local_138.bitsConsumed + (int)uVar13 * -8;
                goto LAB_0015043a;
              }
              if (local_138.bitsConsumed == 0x40) goto LAB_001503cd;
            }
            else {
              uVar13 = (ulong)(local_138.bitsConsumed >> 3);
              local_138.bitsConsumed = local_138.bitsConsumed & 7;
LAB_0015043a:
              local_138.ptr = (char *)((long)local_138.ptr - uVar13);
              local_138.bitContainer = *(size_t *)local_138.ptr;
            }
            bVar5 = false;
            unaff_R13 = 0xffffffffffffffec;
          }
          else {
LAB_001503cd:
            lVar8 = 0;
            do {
              (local_70->entropy).rep[lVar8] = (U32)local_e0[lVar8];
              lVar8 = lVar8 + 1;
            } while (lVar8 != 3);
            bVar5 = true;
          }
          goto LAB_0015034d;
        }
        uVar13 = 0xffffffffffffffec;
        break;
      }
      bVar1 = local_110.table[local_110.state].nbAdditionalBits;
      bVar2 = local_f0.table[local_f0.state].nbAdditionalBits;
      bVar3 = local_100.table[local_100.state].nbAdditionalBits;
      local_60 = (ulong)local_110.table[local_110.state].baseValue;
      local_68 = (ulong)local_f0.table[local_f0.state].baseValue;
      if (bVar3 == 0) {
        uVar19 = 0;
      }
      else {
        uVar19 = ((local_138.bitContainer << ((byte)local_138.bitsConsumed & 0x3f)) >>
                 (-bVar3 & 0x3f)) + (ulong)local_100.table[local_100.state].baseValue;
        local_138.bitsConsumed = local_138.bitsConsumed + bVar3;
      }
      local_58 = unaff_R13;
      local_8c = nbSeq + -1;
      if (bVar3 < 2) {
        lVar8 = uVar19 + (local_60 == 0);
        if (lVar8 != 0) {
          if (lVar8 == 3) {
            uVar13 = local_e0[0] - 1;
          }
          else {
            uVar13 = local_e0[lVar8];
          }
          if (lVar8 != 1) {
            local_e0[2] = local_e0[1];
          }
          local_e0[1] = local_e0[0];
          local_e0[0] = uVar13 + (uVar13 == 0);
        }
      }
      else {
        local_e0[1] = local_e0[0];
        local_e0[2] = uVar13;
        local_e0[0] = uVar19;
      }
      uVar19 = local_e0[0];
      if (bVar2 == 0) {
        uVar13 = 0;
      }
      else {
        uVar13 = (local_138.bitContainer << ((byte)local_138.bitsConsumed & 0x3f)) >>
                 (-bVar2 & 0x3f);
        local_138.bitsConsumed = local_138.bitsConsumed + bVar2;
      }
      if ((0x1e < (uint)bVar2 + (uint)bVar1 + (uint)bVar3) && (local_138.bitsConsumed < 0x41)) {
        if (local_138.ptr < local_138.limitPtr) {
          if (local_138.ptr == local_138.start) goto LAB_0014ff98;
          uVar10 = (ulong)(uint)((int)local_138.ptr - iVar17);
          if (local_138.start <=
              (ulong *)((long)local_138.ptr - (ulong)(local_138.bitsConsumed >> 3))) {
            uVar10 = (ulong)(local_138.bitsConsumed >> 3);
          }
          uVar6 = local_138.bitsConsumed + (int)uVar10 * -8;
        }
        else {
          uVar10 = (ulong)(local_138.bitsConsumed >> 3);
          uVar6 = local_138.bitsConsumed & 7;
        }
        local_138.ptr = (char *)((long)local_138.ptr - uVar10);
        local_138.bitsConsumed = uVar6;
        local_138.bitContainer = *(size_t *)local_138.ptr;
      }
LAB_0014ff98:
      if (bVar1 == 0) {
        local_50 = 0;
      }
      else {
        local_50 = (local_138.bitContainer << ((byte)local_138.bitsConsumed & 0x3f)) >>
                   (-bVar1 & 0x3f);
        local_138.bitsConsumed = local_138.bitsConsumed + bVar1;
      }
      iVar17 = local_138.bitsConsumed + local_110.table[local_110.state].nbBits;
      sVar20 = uVar13 + local_f0.table[local_f0.state].baseValue;
      local_110.state =
           (ulong)((uint)(local_138.bitContainer >> (-(char)iVar17 & 0x3fU)) &
                  BIT_mask[local_110.table[local_110.state].nbBits]) +
           (ulong)local_110.table[local_110.state].nextState;
      iVar17 = iVar17 + (uint)local_f0.table[local_f0.state].nbBits;
      local_f0.state =
           (ulong)((uint)(local_138.bitContainer >> (-(char)iVar17 & 0x3fU)) &
                  BIT_mask[local_f0.table[local_f0.state].nbBits]) +
           (ulong)local_f0.table[local_f0.state].nextState;
      uVar6 = iVar17 + (uint)local_100.table[local_100.state].nbBits;
      local_138._12_4_ = local_138._12_4_;
      local_138.bitsConsumed = uVar6;
      local_50 = local_50 + local_60;
      local_100.state =
           (ulong)((uint)(local_138.bitContainer >> (-(char)uVar6 & 0x3fU)) &
                  BIT_mask[local_100.table[local_100.state].nbBits]) +
           (ulong)local_100.table[local_100.state].nextState;
      sStack_48 = sVar20;
      local_40 = local_e0[0];
      uVar10 = local_50 + sVar20;
      pBVar9 = pBVar15 + uVar10;
      uVar13 = 0xffffffffffffffba;
      if (pBVar9 <= oend_00) {
        pBVar18 = local_a0 + local_50;
        uVar13 = 0xffffffffffffffec;
        if (pBVar18 <= local_a8) {
          pBVar16 = pBVar15 + local_50;
          if (local_98 < pBVar16) {
            sequence.matchLength = sVar20;
            sequence.litLength = local_50;
            sequence.offset = local_e0[0];
            sequence.match = pBStack_38;
            uVar13 = ZSTD_execSequenceLast7
                               (pBVar15,oend_00,sequence,&local_a0,local_a8,base,local_80,local_88);
          }
          else {
            *(undefined8 *)pBVar15 = *(undefined8 *)local_a0;
            if (8 < local_50) {
              pBVar11 = pBVar15 + 8;
              do {
                local_a0 = local_a0 + 8;
                *(undefined8 *)pBVar11 = *(undefined8 *)local_a0;
                pBVar11 = pBVar11 + 8;
              } while (pBVar11 < pBVar16);
            }
            local_a0 = pBVar18;
            pBVar18 = pBVar16 + -local_e0[0];
            if ((ulong)((long)pBVar16 - (long)base) < local_e0[0]) {
              if (local_e0[0] <= (ulong)((long)pBVar16 - (long)local_80)) {
                lVar8 = (long)(pBVar16 + -local_e0[0]) - (long)base;
                pBVar18 = local_88 + lVar8;
                if (local_88 < pBVar18 + sVar20) {
                  memmove(pBVar16,pBVar18,-lVar8);
                  pBVar16 = pBVar16 + -lVar8;
                  sStack_48 = sVar20 + lVar8;
                  if ((pBVar16 <= local_98) && (pBVar18 = base, 2 < sStack_48)) goto LAB_001501df;
                  uVar13 = uVar10;
                  if (sStack_48 != 0) {
                    uVar19 = 0;
                    do {
                      pBVar16[uVar19] = base[uVar19];
                      uVar19 = uVar19 + 1;
                    } while ((uVar19 & 0xffffffff) < sStack_48);
                  }
                }
                else {
                  memmove(pBVar16,pBVar18,sVar20);
                  uVar13 = uVar10;
                }
              }
            }
            else {
LAB_001501df:
              if (uVar19 < 8) {
                iVar17 = *(int *)(ZSTD_execSequence_dec64table + uVar19 * 4);
                *pBVar16 = *pBVar18;
                pBVar16[1] = pBVar18[1];
                pBVar16[2] = pBVar18[2];
                pBVar16[3] = pBVar18[3];
                pBVar11 = pBVar18 + *(uint *)(ZSTD_execSequence_dec32table + local_40 * 4);
                pBVar18 = pBVar18 + ((ulong)*(uint *)(ZSTD_execSequence_dec32table + local_40 * 4) -
                                    (long)iVar17);
                *(undefined4 *)(pBVar16 + 4) = *(undefined4 *)pBVar11;
              }
              else {
                *(undefined8 *)pBVar16 = *(undefined8 *)pBVar18;
              }
              pBVar11 = pBVar16 + 8;
              pBVar18 = pBVar18 + 8;
              if (local_78 < pBVar9) {
                pBVar16 = pBVar11;
                pBVar12 = pBVar18;
                if (pBVar11 < local_98) {
                  do {
                    *(undefined8 *)pBVar16 = *(undefined8 *)pBVar12;
                    pBVar16 = pBVar16 + 8;
                    pBVar12 = pBVar12 + 8;
                  } while (pBVar16 < local_98);
                  pBVar18 = pBVar18 + ((long)local_98 - (long)pBVar11);
                  pBVar11 = local_98;
                }
                for (; uVar13 = uVar10, pBVar11 < pBVar9; pBVar11 = pBVar11 + 1) {
                  BVar4 = *pBVar18;
                  pBVar18 = pBVar18 + 1;
                  *pBVar11 = BVar4;
                }
              }
              else {
                do {
                  *(undefined8 *)pBVar11 = *(undefined8 *)pBVar18;
                  pBVar11 = pBVar11 + 8;
                  pBVar18 = pBVar18 + 8;
                  uVar13 = uVar10;
                } while (pBVar11 < pBVar16 + sStack_48);
              }
            }
          }
        }
      }
      uVar19 = 0;
      if (uVar13 < 0xffffffffffffff89) {
        uVar19 = uVar13;
      }
      pBVar15 = pBVar15 + uVar19;
      unaff_R13 = local_58;
      nbSeq = local_8c;
    } while (uVar13 < 0xffffffffffffff89);
    bVar5 = false;
    pBVar9 = local_a8;
    unaff_R13 = uVar13;
  }
LAB_0015034d:
  if (!bVar5) {
    return unaff_R13;
  }
LAB_00150351:
  sVar20 = (long)pBVar9 - (long)local_a0;
  if ((ulong)((long)oend_00 - (long)pBVar15) < sVar20) {
    pBVar15 = (BYTE *)0xffffffffffffffba;
  }
  else {
    memcpy(pBVar15,local_a0,sVar20);
    pBVar15 = pBVar15 + (sVar20 - (long)dst);
  }
  return (size_t)pBVar15;
}

Assistant:

static size_t
ZSTD_decompressSequences(ZSTD_DCtx* dctx, void* dst, size_t maxDstSize,
                   const void* seqStart, size_t seqSize, int nbSeq,
                   const ZSTD_longOffset_e isLongOffset)
{
    DEBUGLOG(5, "ZSTD_decompressSequences");
#if DYNAMIC_BMI2
    if (dctx->bmi2) {
        return ZSTD_decompressSequences_bmi2(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset);
    }
#endif
  return ZSTD_decompressSequences_default(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset);
}